

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterMeshless.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChMatterMeshless::IntToDescriptor
          (ChMatterMeshless *this,uint off_v,ChStateDelta *v,ChVectorDynamic<> *R,uint off_L,
          ChVectorDynamic<> *L,ChVectorDynamic<> *Qc)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  Index size;
  pointer psVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint local_5c;
  ChVectorRef local_48;
  
  psVar11 = (this->nodes).
            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->nodes).
      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar11) {
    uVar14 = 0;
    local_5c = off_v;
    do {
      uVar13 = (ulong)((int)uVar14 * 3 + off_v);
      if ((v->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3 <
          (long)uVar13) {
LAB_00626727:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      pdVar3 = (v->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      ChVariables::Get_qb(&local_48,
                          &((psVar11[uVar14].
                             super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->variables).super_ChVariables);
      if (local_48.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._8_8_ != 3) {
LAB_00626749:
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                      "void Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>>::resize(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>]"
                     );
      }
      uVar12 = 3;
      if (((local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ & 7) == 0) &&
         (uVar12 = (ulong)(-((uint)((ulong)local_48.
                                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                           ._0_8_ >> 3) & 0x1fffffff) & 7), 2 < uVar12)) {
        uVar12 = 3;
      }
      uVar19 = (ulong)local_5c;
      uVar16 = -uVar12 + 3;
      uVar17 = -uVar12 + 10;
      if (-1 < (long)uVar16) {
        uVar17 = uVar16;
      }
      if (uVar12 != 0) {
        uVar18 = 0;
        do {
          *(double *)
           (local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ + uVar18 * 8) = pdVar3[uVar19 + uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar12 != uVar18);
      }
      lVar15 = (uVar17 & 0xfffffffffffffff8) + uVar12;
      if (7 < (long)uVar16) {
        do {
          pdVar2 = pdVar3 + uVar19 + uVar12;
          dVar4 = pdVar2[1];
          dVar5 = pdVar2[2];
          dVar6 = pdVar2[3];
          dVar7 = pdVar2[4];
          dVar8 = pdVar2[5];
          dVar9 = pdVar2[6];
          dVar10 = pdVar2[7];
          pdVar1 = (double *)
                   (local_48.
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ._0_8_ + uVar12 * 8);
          *pdVar1 = *pdVar2;
          pdVar1[1] = dVar4;
          pdVar1[2] = dVar5;
          pdVar1[3] = dVar6;
          pdVar1[4] = dVar7;
          pdVar1[5] = dVar8;
          pdVar1[6] = dVar9;
          pdVar1[7] = dVar10;
          uVar12 = uVar12 + 8;
        } while ((long)uVar12 < lVar15);
      }
      if (lVar15 < 3) {
        do {
          *(double *)
           (local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ + lVar15 * 8) = pdVar3[uVar19 + lVar15];
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
      }
      if ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3
          < (long)uVar13) goto LAB_00626727;
      pdVar3 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      ChVariables::Get_fb(&local_48,
                          &(((this->nodes).
                             super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar14].
                             super___shared_ptr<chrono::fea::ChNodeMeshless,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->variables).super_ChVariables);
      if (local_48.
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
          ._8_8_ != 3) goto LAB_00626749;
      uVar13 = 3;
      if (((local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ & 7) == 0) &&
         (uVar13 = (ulong)(-((uint)((ulong)local_48.
                                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                           ._0_8_ >> 3) & 0x1fffffff) & 7), 2 < uVar13)) {
        uVar13 = 3;
      }
      uVar17 = -uVar13 + 3;
      uVar12 = -uVar13 + 10;
      if (-1 < (long)uVar17) {
        uVar12 = uVar17;
      }
      if (uVar13 != 0) {
        uVar16 = 0;
        do {
          *(double *)
           (local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ + uVar16 * 8) = pdVar3[uVar19 + uVar16];
          uVar16 = uVar16 + 1;
        } while (uVar13 != uVar16);
      }
      lVar15 = (uVar12 & 0xfffffffffffffff8) + uVar13;
      if (7 < (long)uVar17) {
        do {
          pdVar2 = pdVar3 + uVar19 + uVar13;
          dVar4 = pdVar2[1];
          dVar5 = pdVar2[2];
          dVar6 = pdVar2[3];
          dVar7 = pdVar2[4];
          dVar8 = pdVar2[5];
          dVar9 = pdVar2[6];
          dVar10 = pdVar2[7];
          pdVar1 = (double *)
                   (local_48.
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ._0_8_ + uVar13 * 8);
          *pdVar1 = *pdVar2;
          pdVar1[1] = dVar4;
          pdVar1[2] = dVar5;
          pdVar1[3] = dVar6;
          pdVar1[4] = dVar7;
          pdVar1[5] = dVar8;
          pdVar1[6] = dVar9;
          pdVar1[7] = dVar10;
          uVar13 = uVar13 + 8;
        } while ((long)uVar13 < lVar15);
      }
      if (lVar15 < 3) {
        do {
          *(double *)
           (local_48.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ + lVar15 * 8) = pdVar3[uVar19 + lVar15];
          lVar15 = lVar15 + 1;
        } while (lVar15 != 3);
      }
      uVar14 = (ulong)((int)uVar14 + 1);
      psVar11 = (this->nodes).
                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_5c = local_5c + 3;
    } while (uVar14 < (ulong)((long)(this->nodes).
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeMeshless>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeMeshless>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar11 >> 4)
            );
  }
  return;
}

Assistant:

void ChMatterMeshless::IntToDescriptor(const unsigned int off_v,
                                       const ChStateDelta& v,
                                       const ChVectorDynamic<>& R,
                                       const unsigned int off_L,
                                       const ChVectorDynamic<>& L,
                                       const ChVectorDynamic<>& Qc) {
    for (unsigned int j = 0; j < nodes.size(); j++) {
        nodes[j]->variables.Get_qb() = v.segment(off_v + 3 * j, 3);
        nodes[j]->variables.Get_fb() = R.segment(off_v + 3 * j, 3);
    }
}